

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O3

double FIX::DoubleConvertor::convert(string *value)

{
  bool bVar1;
  FieldConvertError *this;
  double result;
  double local_18;
  
  local_18 = 0.0;
  bVar1 = convert(value,&local_18);
  if (bVar1) {
    return local_18;
  }
  this = (FieldConvertError *)__cxa_allocate_exception(0x50);
  FieldConvertError::FieldConvertError(this,value);
  __cxa_throw(this,&FieldConvertError::typeinfo,Exception::~Exception);
}

Assistant:

EXCEPT(FieldConvertError) {
    double result = 0.0;
    if (!convert(value, result)) {
      throw FieldConvertError(value);
    } else {
      return result;
    }
  }